

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateConstructorAccess
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,bool noArguments,ExprBase *context)

{
  bool bVar1;
  ArrayView<FunctionData_*> functions_00;
  ArrayView<FunctionData*> local_170 [32];
  undefined1 local_150 [8];
  SmallArray<FunctionData_*,_32U> functions;
  ExprBase *context_local;
  bool noArguments_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  functions.allocator = (Allocator *)context;
  SmallArray<FunctionData_*,_32U>::SmallArray
            ((SmallArray<FunctionData_*,_32U> *)local_150,ctx->allocator);
  bVar1 = GetTypeConstructorFunctions
                    (ctx,type,noArguments,(SmallArray<FunctionData_*,_32U> *)local_150);
  if (bVar1) {
    ArrayView<FunctionData*>::ArrayView<32u>(local_170,(SmallArray<FunctionData_*,_32U> *)local_150)
    ;
    functions_00._12_4_ = 0;
    functions_00._0_12_ = local_170._0_12_;
    ctx_local = (ExpressionContext *)
                CreateConstructorAccess(ctx,source,functions_00,(ExprBase *)functions.allocator);
  }
  else {
    ctx_local = (ExpressionContext *)0x0;
  }
  SmallArray<FunctionData_*,_32U>::~SmallArray((SmallArray<FunctionData_*,_32U> *)local_150);
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateConstructorAccess(ExpressionContext &ctx, SynBase *source, TypeBase *type, bool noArguments, ExprBase *context)
{
	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, type, noArguments, functions))
		return CreateConstructorAccess(ctx, source, functions, context);

	return NULL;
}